

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  char cVar4;
  pointer pcVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined7 in_register_00000009;
  size_type *psVar12;
  int iVar13;
  char *pcVar14;
  pointer pbVar15;
  ulong uVar16;
  string *input_00;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  string content;
  string result;
  string local_d8;
  pointer *local_b8;
  pointer local_b0;
  pointer local_a8 [2];
  ulong local_98;
  string *local_90;
  string local_88;
  undefined1 local_68 [32];
  string *local_48;
  undefined4 local_40;
  PreprocessContext local_3c;
  long local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000009,resolveRelative);
  local_90 = input;
  if (context == StripAllGeneratorExpressions) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    lVar11 = std::__cxx11::string::find((char *)input,0x4d4cd3,0);
    if (lVar11 == -1) {
      bVar6 = true;
    }
    else {
      paVar2 = &local_d8.field_2;
      local_48 = __return_storage_ptr__;
      do {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
        std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        pcVar19 = (local_90->_M_dataplus)._M_p + lVar11 + 2;
        iVar13 = 1;
        pcVar17 = pcVar19;
LAB_00327cff:
        cVar3 = *pcVar17;
        if (cVar3 == '$') {
          if (pcVar17[1] == '<') {
            pcVar17 = pcVar17 + 1;
            iVar13 = iVar13 + 1;
          }
LAB_00327d2a:
          pcVar17 = pcVar17 + 1;
          goto LAB_00327cff;
        }
        if (cVar3 != '>') {
          if (cVar3 == '\0') goto LAB_00327d31;
          goto LAB_00327d2a;
        }
        iVar13 = iVar13 + -1;
        if (iVar13 != 0) goto LAB_00327d2a;
        iVar13 = 0;
LAB_00327d31:
        if (cVar3 == '\0') {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_90);
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x4d4cd3);
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8.field_2._8_8_ = puVar10[3];
            local_d8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_d8._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
          }
        }
        input = local_90;
        lVar11 = std::__cxx11::string::find
                           ((char *)local_90,0x4d4cd3,
                            (ulong)(pcVar17 + lVar11 + 2 + (1 - (long)pcVar19)));
      } while (lVar11 != -1);
      bVar6 = iVar13 == 0;
      __return_storage_ptr__ = local_48;
    }
    if (bVar6) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    StripEmptyListElements(__return_storage_ptr__,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_3c = context;
    if (InstallInterface < context) {
      local_48 = __return_storage_ptr__;
      __assert_fail("0 && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpression.cxx"
                    ,0x1b5,
                    "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                   );
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    pcVar17 = (char *)0x0;
    iVar13 = 0;
    local_48 = __return_storage_ptr__;
    do {
      uVar7 = std::__cxx11::string::find((char *)input,0x4db003,(ulong)pcVar17);
      uVar8 = std::__cxx11::string::find((char *)input,0x4db016,(ulong)pcVar17);
      uVar18 = uVar8 & uVar7;
      if (uVar18 != 0xffffffffffffffff) {
        uVar16 = uVar8;
        if (uVar7 < uVar8) {
          uVar16 = uVar7;
        }
        if (uVar8 == 0xffffffffffffffff) {
          uVar16 = uVar7;
        }
        if (uVar7 == 0xffffffffffffffff) {
          uVar16 = uVar8;
        }
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
        std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = (input->_M_dataplus)._M_p;
        cVar3 = pcVar5[uVar16 + 2];
        lVar11 = (ulong)(cVar3 == 'I') * 2 + 0x12;
        uVar16 = (ulong)(cVar3 == 'I') * 2 + 0x12 + uVar16;
        pcVar19 = pcVar5 + uVar16;
        iVar13 = 1;
        pcVar17 = pcVar19;
LAB_00327804:
        cVar4 = *pcVar17;
        if (cVar4 == '$') {
          if (pcVar17[1] == '<') {
            pcVar17 = pcVar17 + 1;
            iVar13 = iVar13 + 1;
          }
LAB_0032782f:
          pcVar17 = pcVar17 + 1;
          goto LAB_00327804;
        }
        if (cVar4 != '>') {
          if (cVar4 == '\0') goto LAB_00327a39;
          goto LAB_0032782f;
        }
        iVar13 = iVar13 + -1;
        if (iVar13 != 0) goto LAB_0032782f;
        if ((local_3c == BuildInterface) && (cVar3 != 'I')) {
          local_98 = uVar18;
          std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_90);
          std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          uVar18 = local_98;
          iVar13 = 0;
        }
        else {
          iVar13 = 0;
          if ((local_3c == InstallInterface) && (cVar3 == 'I')) {
            local_98 = uVar16;
            local_38 = lVar11;
            std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_90);
            if ((char)local_40 == '\0') {
              std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
            }
            else {
              local_b8 = local_a8;
              local_68._0_8_ = (pointer)0x12;
              local_b8 = (pointer *)
                         std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)local_68);
              local_a8[0] = (pointer)local_68._0_8_;
              *local_b8 = (pointer)0x524f504d495f7b24;
              local_b8[1] = (pointer)0x5849464552505f54;
              *(undefined2 *)(local_b8 + 2) = 0x2f7d;
              local_b0 = (pointer)local_68._0_8_;
              *(char *)((long)local_b8 + local_68._0_8_) = '\0';
              local_68._0_8_ = (string *)0x0;
              local_68._8_8_ = (string *)0x0;
              local_68._16_8_ = (pointer)0x0;
              Split(&local_d8,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
              input_00 = (string *)local_68._0_8_;
              if (local_68._0_8_ != local_68._8_8_) {
                do {
                  std::__cxx11::string::append((char *)&local_88);
                  bVar6 = cmsys::SystemTools::FileIsFullPath((input_00->_M_dataplus)._M_p);
                  if ((!bVar6) && (sVar9 = Find(input_00), sVar9 != 0)) {
                    std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_b8);
                  }
                  std::__cxx11::string::_M_append
                            ((char *)&local_88,(ulong)(input_00->_M_dataplus)._M_p);
                  input_00 = input_00 + 1;
                } while (input_00 != (string *)local_68._8_8_);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68);
              if (local_b8 != local_a8) {
                operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
              }
            }
            lVar11 = local_38;
            uVar16 = local_98;
            iVar13 = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
              lVar11 = local_38;
              uVar16 = local_98;
            }
          }
        }
LAB_00327a39:
        input = local_90;
        if (*pcVar17 == '\0') {
          pcVar14 = "$<BUILD_INTERFACE:";
          if (cVar3 == 'I') {
            pcVar14 = "$<INSTALL_INTERFACE:";
          }
          local_b8 = local_a8;
          local_98 = uVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pcVar14,pcVar14 + lVar11);
          std::__cxx11::string::substr((ulong)local_68,(ulong)input);
          pbVar15 = (pointer)0xf;
          if (local_b8 != local_a8) {
            pbVar15 = local_a8[0];
          }
          pbVar1 = (pointer)((long)&((_Alloc_hider *)local_68._8_8_)->_M_p +
                            (long)&(local_b0->_M_dataplus)._M_p);
          if (pbVar15 < pbVar1) {
            pbVar15 = (pointer)0xf;
            if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
              pbVar15 = (pointer)local_68._16_8_;
            }
            if (pbVar15 < pbVar1) goto LAB_00327aec;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,(ulong)local_b8);
          }
          else {
LAB_00327aec:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_b8,local_68._0_8_);
          }
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8.field_2._8_8_ = puVar10[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_d8._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)psVar12 = 0;
          std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_68._16_8_)->_M_p + 1));
          }
          uVar16 = local_98;
          if (local_b8 != local_a8) {
            operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
            uVar16 = local_98;
          }
        }
        pcVar17 = pcVar17 + uVar16 + (1 - (long)pcVar19);
      }
      __return_storage_ptr__ = local_48;
    } while (uVar18 != 0xffffffffffffffff);
    if (iVar13 == 0) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    StripEmptyListElements(__return_storage_ptr__,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_88._M_dataplus._M_p,
                  CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                           local_88.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string &input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions)
    {
    return stripAllGeneratorExpressions(input);
    }
  else if (context == BuildInterface || context == InstallInterface)
    {
    return stripExportInterface(input, context, resolveRelative);
    }

  assert(0 && "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}